

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O3

int tbx_readrec(BGZF *fp,void *tbxv,void *sv,int *tid,int *beg,int *end)

{
  char cVar1;
  int iVar2;
  int iVar3;
  khint_t kVar4;
  kh_s2i_t *h;
  char *pcVar5;
  char *pcVar6;
  tbx_intv_t local_58;
  
  iVar2 = bgzf_getline(fp,10,(kstring_t *)sv);
  if (-1 < iVar2) {
    iVar3 = tbx_parse1((tbx_conf_t *)tbxv,*sv,*(char **)((long)sv + 0x10),&local_58);
    if (iVar3 == 0) {
      cVar1 = *local_58.se;
      *local_58.se = '\0';
      h = *(kh_s2i_t **)((long)tbxv + 0x20);
      if (h == (kh_s2i_t *)0x0) {
        h = kh_init_s2i();
        *(kh_s2i_t **)((long)tbxv + 0x20) = h;
      }
      kVar4 = kh_get_s2i(h,local_58.ss);
      if (kVar4 == h->n_buckets) {
        *local_58.se = cVar1;
        local_58.tid = -1;
      }
      else {
        local_58.tid = (int)h->vals[kVar4];
        *local_58.se = cVar1;
      }
    }
    else {
      pcVar6 = "TBX_GENERIC";
      if (*tbxv == 2) {
        pcVar6 = "TBX_VCF";
      }
      pcVar5 = "TBX_SAM";
      if (*tbxv != 1) {
        pcVar5 = pcVar6;
      }
      fprintf(_stderr,
              "[E::%s] failed to parse %s, was wrong -p [type] used?\nThe offending line was: \"%s\"\n"
              ,"get_intv",pcVar5,*(undefined8 *)((long)sv + 0x10));
    }
    *tid = local_58.tid;
    *beg = (int)local_58.beg;
    *end = (int)local_58.end;
  }
  return iVar2;
}

Assistant:

int tbx_readrec(BGZF *fp, void *tbxv, void *sv, int *tid, int *beg, int *end)
{
    tbx_t *tbx = (tbx_t *) tbxv;
    kstring_t *s = (kstring_t *) sv;
    int ret;
    if ((ret = bgzf_getline(fp, '\n', s)) >= 0) {
        tbx_intv_t intv;
        get_intv(tbx, s, &intv, 0);
        *tid = intv.tid; *beg = intv.beg; *end = intv.end;
    }
    return ret;
}